

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64.c
# Opt level: O3

void roaring64_bitmap_or_inplace(roaring64_bitmap_t *r1,roaring64_bitmap_t *r2)

{
  ulong uVar1;
  art_val_t *paVar2;
  int iVar3;
  container_t *pcVar4;
  leaf_t val;
  container_t *pcVar5;
  ulong uVar6;
  art_iterator_t *iterator;
  bool bVar7;
  bool bVar8;
  uint8_t typecode2;
  art_iterator_t it1;
  art_iterator_t it2;
  uint8_t local_161;
  uint8_t local_160 [8];
  roaring64_bitmap_t *local_158;
  art_iterator_t local_150;
  art_iterator_t local_c0;
  
  if (r1 != r2) {
    art_init_iterator(&local_150,&r1->art,true);
    art_init_iterator(&local_c0,&r2->art,true);
    bVar7 = local_150.value != (ulong *)0x0;
    bVar8 = local_c0.value != (ulong *)0x0;
    local_158 = r2;
    if (bVar7 || bVar8) {
      do {
        iterator = &local_150;
        if ((bVar7) && (bVar8)) {
          iVar3 = art_compare_keys(iterator->key,local_c0.key);
          paVar2 = local_150.value;
          if (iVar3 == 0) {
            uVar6 = *local_c0.value;
            uVar1 = *local_150.value;
            pcVar4 = r1->containers[uVar1 >> 8];
            if ((char)uVar1 != '\x04') {
              if ((uint8_t)uVar6 == '\x04') {
                uVar6 = (ulong)*(byte *)((long)r2->containers[uVar6 >> 8] + 8);
              }
              local_160[0] = '\0';
              local_160[1] = '\0';
              local_160[2] = '\0';
              local_160[3] = '\0';
              local_160[4] = '\0';
              local_160[5] = '\0';
              local_160[6] = '\0';
              local_160[7] = '\0';
              (*(code *)(&DAT_00137338 +
                        *(int *)(&DAT_00137338 +
                                (ulong)((((uint)uVar6 & 0xff) + ((uint)uVar1 & 0xff) * 4) - 5) * 4))
              )();
              return;
            }
            pcVar5 = container_or(pcVar4,'\x04',r2->containers[uVar6 >> 8],(uint8_t)uVar6,&local_161
                                 );
            if (pcVar5 != pcVar4) {
              container_free(pcVar4,'\x04');
              uVar6 = *paVar2;
              r1->containers[uVar6 >> 8] = pcVar5;
              *paVar2 = CONCAT71((int7)(uVar6 >> 8),local_161);
            }
            art_iterator_next(&local_150);
            art_iterator_next(&local_c0);
            r2 = local_158;
          }
          else {
            if ((bool)(bVar8 & -1 < iVar3)) {
LAB_00117101:
              local_160[0] = (char)*local_c0.value;
              pcVar4 = get_copy_of_container(r2->containers[*local_c0.value >> 8],local_160,false);
              val = add_container(r1,pcVar4,local_160[0]);
              art_iterator_insert(iterator,local_c0.key,val);
              iterator = &local_c0;
            }
LAB_00117144:
            art_iterator_next(iterator);
          }
        }
        else if (bVar7) {
          if (!bVar8) goto LAB_00117144;
        }
        else if (bVar8) goto LAB_00117101;
        bVar7 = local_150.value != (ulong *)0x0;
        bVar8 = local_c0.value != (ulong *)0x0;
      } while (bVar7 || bVar8);
    }
  }
  return;
}

Assistant:

void roaring64_bitmap_or_inplace(roaring64_bitmap_t *r1,
                                 const roaring64_bitmap_t *r2) {
    if (r1 == r2) {
        return;
    }
    art_iterator_t it1 = art_init_iterator(&r1->art, /*first=*/true);
    art_iterator_t it2 = art_init_iterator((art_t *)&r2->art, /*first=*/true);

    while (it1.value != NULL || it2.value != NULL) {
        bool it1_present = it1.value != NULL;
        bool it2_present = it2.value != NULL;

        // Cases:
        // 1. it1_present  && !it2_present -> it1++
        // 2. !it1_present && it2_present  -> add it2, it2++
        // 3. it1_present  && it2_present
        //    a. it1 <  it2 -> it1++
        //    b. it1 == it2 -> it1 | it2, it1++, it2++
        //    c. it1 >  it2 -> add it2, it2++
        int compare_result = 0;
        if (it1_present && it2_present) {
            compare_result = compare_high48(it1.key, it2.key);
            if (compare_result == 0) {
                // Case 3b: iterators at the same high key position.
                leaf_t *leaf1 = (leaf_t *)it1.value;
                leaf_t leaf2 = (leaf_t)*it2.value;
                uint8_t typecode1 = get_typecode(*leaf1);
                container_t *container1 = get_container(r1, *leaf1);
                uint8_t typecode2;
                container_t *container2;
                if (get_typecode(*leaf1) == SHARED_CONTAINER_TYPE) {
                    container2 = container_or(container1, typecode1,
                                              get_container(r2, leaf2),
                                              get_typecode(leaf2), &typecode2);
                } else {
                    container2 = container_ior(container1, typecode1,
                                               get_container(r2, leaf2),
                                               get_typecode(leaf2), &typecode2);
                }
                if (container2 != container1) {
                    container_free(container1, typecode1);
                    replace_container(r1, leaf1, container2, typecode2);
                }
                art_iterator_next(&it1);
                art_iterator_next(&it2);
            }
        }
        if ((it1_present && !it2_present) || compare_result < 0) {
            // Cases 1 and 3a: it1 is the only iterator or is before it2.
            art_iterator_next(&it1);
        } else if ((!it1_present && it2_present) || compare_result > 0) {
            // Cases 2 and 3c: it2 is the only iterator or is before it1.
            leaf_t result_leaf =
                copy_leaf_container(r2, r1, (leaf_t)*it2.value);
            art_iterator_insert(&it1, it2.key, (art_val_t)result_leaf);
            art_iterator_next(&it2);
        }
    }
}